

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_nb_type(Curl_easy *data,connectdata *conn,_Bool ascii,ftpstate newstate)

{
  char cVar1;
  char want;
  CURLcode result;
  ftp_conn *ftpc;
  ftpstate newstate_local;
  _Bool ascii_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cVar1 = 'I';
  if (ascii) {
    cVar1 = 'A';
  }
  if ((conn->proto).ftpc.transfertype == cVar1) {
    _ftp_state(data,newstate);
    data_local._4_4_ = ftp_state_type_resp(data,200,newstate);
  }
  else {
    data_local._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"TYPE %c",(ulong)(uint)(int)cVar1);
    if (data_local._4_4_ == CURLE_OK) {
      _ftp_state(data,newstate);
      (conn->proto).ftpc.transfertype = cVar1;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_nb_type(struct Curl_easy *data,
                            struct connectdata *conn,
                            bool ascii, ftpstate newstate)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  char want = (char)(ascii ? 'A' : 'I');

  if(ftpc->transfertype == want) {
    ftp_state(data, newstate);
    return ftp_state_type_resp(data, 200, newstate);
  }

  result = Curl_pp_sendf(data, &ftpc->pp, "TYPE %c", want);
  if(!result) {
    ftp_state(data, newstate);

    /* keep track of our current transfer type */
    ftpc->transfertype = want;
  }
  return result;
}